

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_notation.cpp
# Opt level: O0

ScientificNotation __thiscall
icu_63::number::ScientificNotation::withMinExponentDigits
          (ScientificNotation *this,int32_t minExponentDigits)

{
  ScientificSettings SVar1;
  Notation NVar2;
  NotationType local_38;
  NotationUnion local_34;
  NotationUnion union_;
  ScientificSettings settings;
  int32_t minExponentDigits_local;
  ScientificNotation *this_local;
  undefined4 local_c;
  
  settings._0_4_ = minExponentDigits;
  unique0x100000b6 = this;
  if ((minExponentDigits < 1) || (999 < minExponentDigits)) {
    Notation((ScientificNotation *)((long)&this_local + 4),U_NUMBER_ARG_OUTOFBOUNDS_ERROR);
  }
  else {
    SVar1 = (this->super_Notation).fUnion.scientific;
    union_.scientific.fExponentSignDisplay = SVar1.fExponentSignDisplay;
    union_.compactStyle._0_2_ = SVar1._0_2_;
    union_.scientific.fMinExponentDigits = (short)minExponentDigits;
    local_34 = union_;
    local_38 = NTN_SCIENTIFIC;
    Notation((ScientificNotation *)((long)&this_local + 4),&local_38,&local_34);
  }
  NVar2.fUnion.scientific.fExponentSignDisplay = local_c;
  NVar2._0_8_ = stack0xffffffffffffffec;
  return (ScientificNotation)NVar2;
}

Assistant:

ScientificNotation
ScientificNotation::withMinExponentDigits(int32_t minExponentDigits) const {
    if (minExponentDigits >= 1 && minExponentDigits <= kMaxIntFracSig) {
        ScientificSettings settings = fUnion.scientific;
        settings.fMinExponentDigits = static_cast<digits_t>(minExponentDigits);
        NotationUnion union_ = {settings};
        return {NTN_SCIENTIFIC, union_};
    } else {
        return {U_NUMBER_ARG_OUTOFBOUNDS_ERROR};
    }
}